

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_fission.cpp
# Opt level: O0

void __thiscall
spvtools::opt::LoopFissionPass::LoopFissionPass
          (LoopFissionPass *this,size_t register_threshold_to_split,bool split_multiple_times)

{
  anon_class_8_1_94a4b926 local_28;
  byte local_19;
  size_t sStack_18;
  bool split_multiple_times_local;
  size_t register_threshold_to_split_local;
  LoopFissionPass *this_local;
  
  local_19 = split_multiple_times;
  sStack_18 = register_threshold_to_split;
  register_threshold_to_split_local = (size_t)this;
  Pass::Pass(&this->super_Pass);
  (this->super_Pass)._vptr_Pass = (_func_int **)&PTR__LoopFissionPass_0082f608;
  std::function<bool_(const_spvtools::opt::RegisterLiveness::RegionRegisterLiveness_&)>::function
            (&this->split_criteria_);
  this->split_multiple_times_ = (bool)(local_19 & 1);
  local_28.register_threshold_to_split = sStack_18;
  std::function<bool(spvtools::opt::RegisterLiveness::RegionRegisterLiveness_const&)>::operator=
            ((function<bool(spvtools::opt::RegisterLiveness::RegionRegisterLiveness_const&)> *)
             &this->split_criteria_,&local_28);
  return;
}

Assistant:

LoopFissionPass::LoopFissionPass(const size_t register_threshold_to_split,
                                 bool split_multiple_times)
    : split_multiple_times_(split_multiple_times) {
  // Split if the number of registers in the loop exceeds
  // |register_threshold_to_split|.
  split_criteria_ =
      [register_threshold_to_split](
          const RegisterLiveness::RegionRegisterLiveness& liveness) {
        return liveness.used_registers_ > register_threshold_to_split;
      };
}